

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O0

size_t __thiscall ODDLParser::Reference::sizeInBytes(Reference *this)

{
  Name *name;
  size_t i;
  size_t size;
  Reference *this_local;
  
  if (this->m_numRefs == 0) {
    this_local = (Reference *)0x0;
  }
  else {
    i = 0;
    for (name = (Name *)0x0; name < (Name *)this->m_numRefs;
        name = (Name *)((long)&name->m_type + 1)) {
      if (this->m_referencedName[(long)name] != (Name *)0x0) {
        i = this->m_referencedName[(long)name]->m_id->m_len + i;
      }
    }
    this_local = (Reference *)i;
  }
  return (size_t)this_local;
}

Assistant:

size_t Reference::sizeInBytes() {
    if ( 0 == m_numRefs ) {
        return 0;
    }

    size_t size( 0 );
    for ( size_t i = 0; i < m_numRefs; i++ ) {
        Name *name( m_referencedName[ i ] );
        if ( ddl_nullptr != name ) {
            size += name->m_id->m_len;
        }
    }

    return size;
}